

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_dec.c
# Opt level: O1

jas_image_t * pnm_decode(jas_stream_t *in,char *optstr)

{
  byte *pbVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  jas_tvparser_t *tvp;
  jas_taginfo_t *pjVar8;
  jas_image_t *image;
  jas_image_cmpt_t **ppjVar9;
  char *pcVar10;
  jas_image_cmpttype_t jVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  jas_image_cmptparm_t *pjVar16;
  ulonglong uVar17;
  pnm_hdr_t hdr;
  int_fast32_t width;
  jas_image_cmptparm_t cmptparms [3];
  int local_118;
  pnm_hdr_t local_110;
  uint_fast32_t local_f8;
  uint local_ec;
  uint local_e8 [2];
  int local_e0 [2];
  jas_image_cmptparm_t local_d8 [3];
  
  iVar5 = jas_getdbglevel();
  local_f8 = CONCAT44(local_f8._4_4_,iVar5);
  if (9 < iVar5) {
    pcVar10 = optstr;
    if (optstr == (char *)0x0) {
      pcVar10 = "";
    }
    jas_eprintf("pnm_decode(%p, \"%s\")\n",in,pcVar10);
  }
  pcVar10 = "";
  if (optstr != (char *)0x0) {
    pcVar10 = optstr;
  }
  tvp = jas_tvparser_create(pcVar10);
  if (tvp == (jas_tvparser_t *)0x0) {
    local_118 = 0;
    uVar17 = 0x4000000;
  }
  else {
    iVar5 = jas_tvparser_next(tvp);
    if (iVar5 == 0) {
      uVar17 = 0x4000000;
      local_118 = 0;
      do {
        pcVar10 = jas_tvparser_gettag(tvp);
        pjVar8 = jas_taginfos_lookup(pnm_decopts,pcVar10);
        pjVar8 = jas_taginfo_nonull(pjVar8);
        if (pjVar8->id == 1) {
          pcVar10 = jas_tvparser_getval(tvp);
          uVar17 = strtoull(pcVar10,(char **)0x0,10);
        }
        else if (pjVar8->id == 0) {
          pcVar10 = jas_tvparser_getval(tvp);
          local_118 = atoi(pcVar10);
        }
        else {
          jas_eprintf("warning: ignoring invalid option %s\n",pcVar10);
        }
        iVar5 = jas_tvparser_next(tvp);
      } while (iVar5 == 0);
    }
    else {
      local_118 = 0;
      uVar17 = 0x4000000;
    }
    jas_tvparser_destroy(tvp);
  }
  if (tvp != (jas_tvparser_t *)0x0) {
    uVar12 = 0xffffffff;
    if ((in->flags_ & 7U) == 0) {
      if ((in->rwlimit_ < 0) || (in->rwcnt_ < in->rwlimit_)) {
        iVar5 = in->cnt_;
        in->cnt_ = iVar5 + -1;
        if (iVar5 < 1) {
          uVar12 = jas_stream_fillbuf(in,1);
        }
        else {
          in->rwcnt_ = in->rwcnt_ + 1;
          pbVar1 = in->ptr_;
          in->ptr_ = pbVar1 + 1;
          uVar12 = (uint)*pbVar1;
        }
      }
      else {
        in->flags_ = in->flags_ | 4;
      }
    }
    if (uVar12 != 0xffffffff) {
      uVar6 = 0xffffffff;
      if ((in->flags_ & 7U) == 0) {
        if ((in->rwlimit_ < 0) || (in->rwcnt_ < in->rwlimit_)) {
          iVar5 = in->cnt_;
          in->cnt_ = iVar5 + -1;
          if (iVar5 < 1) {
            uVar6 = jas_stream_fillbuf(in,1);
          }
          else {
            in->rwcnt_ = in->rwcnt_ + 1;
            pbVar1 = in->ptr_;
            in->ptr_ = pbVar1 + 1;
            uVar6 = (uint)*pbVar1;
          }
        }
        else {
          in->flags_ = in->flags_ | 4;
        }
      }
      if (uVar6 != 0xffffffff) {
        uVar12 = uVar6 & 0xff | (uVar12 & 0xff) << 8;
        local_110.magic = uVar12;
        iVar5 = pnm_getsintstr(in,(int_fast32_t *)local_e0);
        if ((iVar5 == 0) && (iVar5 = pnm_getsintstr(in,(int_fast32_t *)local_e8), iVar5 == 0)) {
          local_110.width = local_e0[0];
          local_110.height = local_e8[0];
          iVar5 = pnm_type((ulong)uVar12);
          if (iVar5 != 0) {
            if (iVar5 == 1) {
              local_d8[0].tlx = 1;
            }
            else {
              iVar7 = pnm_getsintstr(in,&local_d8[0].tlx);
              if (iVar7 != 0) goto LAB_00134455;
            }
            local_110.maxval = -(int)local_d8[0].tlx;
            if (-1 < local_d8[0].tlx) {
              local_110.maxval = (int)local_d8[0].tlx;
            }
            local_110.sgnd = SUB81((ulong)local_d8[0].tlx >> 0x3f,0);
            if (2 < iVar5 - 1U) {
              abort();
            }
            local_110.numcmpts = *(int *)(&DAT_0013e998 + (ulong)(iVar5 - 1U) * 4);
            if (9 < (int)local_f8) {
              jas_eprintf("magic %lx; width %lu; height %ld; numcmpts %d; maxval %ld; sgnd %d\n",
                          (long)local_110.magic,(long)local_110.width,(long)local_110.height,
                          (ulong)(uint)local_110.numcmpts,(long)local_110.maxval,
                          (uint)local_110.sgnd);
            }
            iVar5 = local_110.numcmpts;
            lVar15 = (long)local_110.width;
            if (0 < local_110.height && 0 < lVar15) {
              uVar13 = (ulong)(uint)local_110.height;
              uVar14 = uVar13 * lVar15;
              if ((uVar14 == 0) ||
                 (auVar2._8_8_ = 0, auVar2._0_8_ = uVar14, auVar3._8_8_ = 0,
                 auVar3._0_8_ = (long)local_110.numcmpts, SUB168(auVar2 * auVar3,8) == 0)) {
                uVar14 = uVar14 * (long)local_110.numcmpts;
                bVar4 = true;
              }
              else {
                bVar4 = false;
              }
              if (!bVar4) {
                image = (jas_image_t *)0x0;
                jas_eprintf("image too large\n");
                goto LAB_00134458;
              }
              if ((uVar17 != 0) && (uVar17 < uVar14)) {
                image = (jas_image_t *)0x0;
                jas_eprintf("maximum number of samples would be exceeded (%zu > %zu)\n",uVar14,
                            uVar17);
                goto LAB_00134458;
              }
              if (0 < local_110.numcmpts) {
                local_f8 = (uint_fast32_t)local_110.maxval;
                local_ec = (uint)local_110.sgnd;
                pjVar16 = local_d8;
                uVar12 = local_110.numcmpts;
                do {
                  pjVar16->tlx = 0;
                  pjVar16->tly = 0;
                  pjVar16->hstep = 1;
                  pjVar16->vstep = 1;
                  pjVar16->width = lVar15;
                  pjVar16->height = uVar13;
                  iVar7 = pnm_maxvaltodepth(local_f8);
                  pjVar16->prec = iVar7;
                  pjVar16->sgnd = local_ec;
                  pjVar16 = pjVar16 + 1;
                  uVar12 = uVar12 - 1;
                } while (uVar12 != 0);
              }
              image = jas_image_create(iVar5,local_d8,0x4000);
              if (image != (jas_image_t *)0x0) {
                if (iVar5 == 3) {
                  image->clrspc_ = 0x401;
                  ppjVar9 = image->cmpts_;
                  (*ppjVar9)->type_ = 0;
                  ppjVar9[1]->type_ = 1;
                  ppjVar9 = ppjVar9 + 2;
                  jVar11 = 2;
                }
                else {
                  image->clrspc_ = 0x301;
                  ppjVar9 = image->cmpts_;
                  jVar11 = 0;
                }
                (*ppjVar9)->type_ = jVar11;
                iVar5 = pnm_getdata(in,&local_110,image,local_118);
                if (iVar5 == 0) {
                  return image;
                }
                goto LAB_00134458;
              }
            }
          }
        }
      }
    }
  }
LAB_00134455:
  image = (jas_image_t *)0x0;
LAB_00134458:
  if (image != (jas_image_t *)0x0) {
    jas_image_destroy(image);
  }
  return (jas_image_t *)0x0;
}

Assistant:

jas_image_t *pnm_decode(jas_stream_t *in, const char *optstr)
{
	pnm_hdr_t hdr;
	jas_image_t *image;
	jas_image_cmptparm_t cmptparms[3];
	jas_image_cmptparm_t *cmptparm;
	int i;
	pnm_dec_importopts_t opts;
	size_t num_samples;

	image = 0;

	JAS_DBGLOG(10, ("pnm_decode(%p, \"%s\")\n", in, optstr ? optstr : ""));

	if (pnm_dec_parseopts(optstr, &opts)) {
		goto error;
	}

	/* Read the file header. */
	if (pnm_gethdr(in, &hdr)) {
		goto error;
	}
	JAS_DBGLOG(10, (
	  "magic %lx; width %lu; height %ld; numcmpts %d; maxval %ld; sgnd %d\n",
	  JAS_CAST(unsigned long, hdr.magic), JAS_CAST(long, hdr.width),
	  JAS_CAST(long, hdr.height), hdr.numcmpts, JAS_CAST(long, hdr.maxval),
	  hdr.sgnd)
	  );

	if (hdr.width <= 0 || hdr.height <= 0) {
		goto error;
	}

	if (!jas_safe_size_mul3(hdr.width, hdr.height, hdr.numcmpts,
	  &num_samples)) {
		jas_eprintf("image too large\n");
		goto error;
	}
	if (opts.max_samples > 0 && num_samples > opts.max_samples) {
		jas_eprintf(
		  "maximum number of samples would be exceeded (%zu > %zu)\n",
		  num_samples, opts.max_samples);
		goto error;
	}

	/* Create an image of the correct size. */
	for (i = 0, cmptparm = cmptparms; i < hdr.numcmpts; ++i, ++cmptparm) {
		cmptparm->tlx = 0;
		cmptparm->tly = 0;
		cmptparm->hstep = 1;
		cmptparm->vstep = 1;
		cmptparm->width = hdr.width;
		cmptparm->height = hdr.height;
		cmptparm->prec = pnm_maxvaltodepth(hdr.maxval);
		cmptparm->sgnd = hdr.sgnd;
	}
	if (!(image = jas_image_create(hdr.numcmpts, cmptparms,
	  JAS_CLRSPC_UNKNOWN))) {
		goto error;
	}

	if (hdr.numcmpts == 3) {
		jas_image_setclrspc(image, JAS_CLRSPC_SRGB);
		jas_image_setcmpttype(image, 0,
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_RGB_R));
		jas_image_setcmpttype(image, 1,
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_RGB_G));
		jas_image_setcmpttype(image, 2,
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_RGB_B));
	} else {
		jas_image_setclrspc(image, JAS_CLRSPC_SGRAY);
		jas_image_setcmpttype(image, 0,
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_GRAY_Y));
	}

	/* Read image data from stream into image. */
	if (pnm_getdata(in, &hdr, image, opts.allow_trunc)) {
		goto error;
	}

	return image;

error:
	if (image) {
		jas_image_destroy(image);
	}
	return 0;
}